

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

size_t mz_zip_file_write_func(void *pOpaque,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  int iVar1;
  mz_uint64 mVar2;
  mz_int64 cur_ofs;
  mz_zip_archive *pZip;
  size_t n_local;
  void *pBuf_local;
  mz_uint64 file_ofs_local;
  void *pOpaque_local;
  
  mVar2 = ftello(*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60));
  if ((long)file_ofs < 0) {
LAB_00bc6bd2:
    pOpaque_local = (void *)0x0;
  }
  else {
    if (mVar2 != file_ofs) {
      iVar1 = fseeko(*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60),file_ofs,0);
      if (iVar1 != 0) goto LAB_00bc6bd2;
    }
    pOpaque_local = (void *)fwrite(pBuf,1,n,*(FILE **)(*(long *)((long)pOpaque + 0x58) + 0x60));
  }
  return (size_t)pOpaque_local;
}

Assistant:

static size_t mz_zip_file_write_func(void *pOpaque, mz_uint64 file_ofs,
                                     const void *pBuf, size_t n) {
  mz_zip_archive *pZip = (mz_zip_archive *)pOpaque;
  mz_int64 cur_ofs = MZ_FTELL64(pZip->m_pState->m_pFile);
  if (((mz_int64)file_ofs < 0) ||
      (((cur_ofs != (mz_int64)file_ofs)) &&
       (MZ_FSEEK64(pZip->m_pState->m_pFile, (mz_int64)file_ofs, SEEK_SET))))
    return 0;
  return MZ_FWRITE(pBuf, 1, n, pZip->m_pState->m_pFile);
}